

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall chrono::ChAssembly::ArchiveOUT(ChAssembly *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
  local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChAssembly>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_38._value = &this->bodylist;
  local_38._name = "bodies";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::ChBody>>(marchive,&local_38);
  local_38._value =
       (vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_> *
       )&this->shaftlist;
  local_38._name = "shafts";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::ChShaft>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_> *
       )&this->linklist;
  local_38._name = "links";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::ChLinkBase>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_> *
       )&this->meshlist;
  local_38._name = "meshes";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::fea::ChMesh>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>_>
                       *)&local_38);
  local_38._value =
       (vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_> *
       )&this->otherphysicslist;
  local_38._name = "other_physics_items";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::ChPhysicsItem>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>_>
                       *)&local_38);
  return;
}

Assistant:

void ChAssembly::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChAssembly>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:

    marchive << CHNVP(bodylist, "bodies");
    marchive << CHNVP(shaftlist, "shafts");
    marchive << CHNVP(linklist, "links");
    marchive << CHNVP(meshlist, "meshes");
    marchive << CHNVP(otherphysicslist, "other_physics_items");
}